

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es2fTextureSpecificationTests.cpp
# Opt level: O0

void __thiscall
deqp::gles2::Functional::TexSubImageCubeAlignCase::TexSubImageCubeAlignCase
          (TexSubImageCubeAlignCase *this,Context *context,char *name,char *desc,deUint32 format,
          deUint32 dataType,int width,int height,int subX,int subY,int subW,int subH,int alignment)

{
  TextureFormat format_00;
  deUint32 dataType_local;
  deUint32 format_local;
  char *desc_local;
  char *name_local;
  Context *context_local;
  TexSubImageCubeAlignCase *this_local;
  
  format_00 = glu::mapGLTransferFormat(format,dataType);
  TextureSpecCase::TextureSpecCase
            (&this->super_TextureSpecCase,context,name,desc,TEXTURETYPE_CUBE,format_00,0,width,
             height);
  (this->super_TextureSpecCase).super_TestCase.super_TestCase.super_TestNode._vptr_TestNode =
       (_func_int **)&PTR__TexSubImageCubeAlignCase_00cad9d8;
  this->m_format = format;
  this->m_dataType = dataType;
  this->m_subX = subX;
  this->m_subY = subY;
  this->m_subW = subW;
  this->m_subH = subH;
  this->m_alignment = alignment;
  return;
}

Assistant:

TexSubImageCubeAlignCase (Context& context, const char* name, const char* desc, deUint32 format, deUint32 dataType, int width, int height, int subX, int subY, int subW, int subH, int alignment)
		: TextureSpecCase	(context, name, desc, TEXTURETYPE_CUBE, glu::mapGLTransferFormat(format, dataType), 0 /* Mipmaps are never used */, width, height)
		, m_format			(format)
		, m_dataType		(dataType)
		, m_subX			(subX)
		, m_subY			(subY)
		, m_subW			(subW)
		, m_subH			(subH)
		, m_alignment		(alignment)
	{
	}